

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O1

png_uint_32
png_get_oFFs(png_const_structrp png_ptr,png_const_inforp info_ptr,png_int_32 *offset_x,
            png_int_32 *offset_y,int *unit_type)

{
  png_uint_32 pVar1;
  
  pVar1 = 0;
  if ((((info_ptr != (png_const_inforp)0x0 && png_ptr != (png_const_structrp)0x0) &&
       (unit_type != (int *)0x0)) && (offset_y != (png_int_32 *)0x0)) &&
     ((offset_x != (png_int_32 *)0x0 && ((info_ptr->valid & 0x100) != 0)))) {
    *offset_x = info_ptr->x_offset;
    *offset_y = info_ptr->y_offset;
    *unit_type = (uint)info_ptr->offset_unit_type;
    pVar1 = 0x100;
  }
  return pVar1;
}

Assistant:

png_uint_32 PNGAPI
png_get_oFFs(png_const_structrp png_ptr, png_const_inforp info_ptr,
    png_int_32 *offset_x, png_int_32 *offset_y, int *unit_type)
{
   png_debug1(1, "in %s retrieval function", "oFFs");

   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->valid & PNG_INFO_oFFs) != 0 &&
       offset_x != NULL && offset_y != NULL && unit_type != NULL)
   {
      *offset_x = info_ptr->x_offset;
      *offset_y = info_ptr->y_offset;
      *unit_type = (int)info_ptr->offset_unit_type;
      return (PNG_INFO_oFFs);
   }

   return (0);
}